

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O2

int Cba_NtkInsertGiaLit(Cba_Ntk_t *p,int iLit,Vec_Int_t *vLit2Fon,int fUseXor)

{
  int iVar1;
  int iVar2;
  
  if ((uint)iLit < 2) {
    iVar1 = Cba_FonFromConst(iLit);
    return iVar1;
  }
  iVar1 = Vec_IntEntry(vLit2Fon,iLit);
  if (-1 < iVar1) {
    iVar1 = Vec_IntEntry(vLit2Fon,iLit);
    return iVar1;
  }
  iVar1 = Abc_LitIsCompl(iLit);
  if (iVar1 == 0) {
    __assert_fail("Abc_LitIsCompl(iLit)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaNtk.c"
                  ,0x3f0,"int Cba_NtkInsertGiaLit(Cba_Ntk_t *, int, Vec_Int_t *, int)");
  }
  iVar1 = Abc_LitNot(iLit);
  iVar1 = Vec_IntEntry(vLit2Fon,iVar1);
  if (-1 < iVar1) {
    if (fUseXor == 0) {
      iVar1 = Cba_ObjAlloc(p,CBA_BOX_INV,1,1);
      iVar2 = Abc_LitNot(iLit);
      iVar2 = Vec_IntEntry(vLit2Fon,iVar2);
    }
    else {
      iVar1 = Cba_ObjAlloc(p,CBA_BOX_XOR,2,1);
      iVar2 = Abc_LitNot(iLit);
      iVar2 = Vec_IntEntry(vLit2Fon,iVar2);
      Cba_ObjSetFinFon(p,iVar1,0,iVar2);
      iVar2 = -2;
    }
    Cba_ObjSetFinFon(p,iVar1,(uint)(fUseXor != 0),iVar2);
    iVar2 = Cba_ObjFon0(p,iVar1);
    Vec_IntWriteEntry(vLit2Fon,iLit,iVar2);
    iVar1 = Cba_ObjFon0(p,iVar1);
    return iVar1;
  }
  __assert_fail("Vec_IntEntry(vLit2Fon, Abc_LitNot(iLit)) >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaNtk.c"
                ,0x3f1,"int Cba_NtkInsertGiaLit(Cba_Ntk_t *, int, Vec_Int_t *, int)");
}

Assistant:

static inline int Cba_NtkInsertGiaLit( Cba_Ntk_t * p, int iLit, Vec_Int_t * vLit2Fon, int fUseXor )
{
    int iObjNew;
    if ( iLit == 0 || iLit == 1 )
        return Cba_FonFromConst(iLit);
    if ( Vec_IntEntry(vLit2Fon, iLit) >= 0 )
        return Vec_IntEntry(vLit2Fon, iLit);
    assert( Abc_LitIsCompl(iLit) );
    assert( Vec_IntEntry(vLit2Fon, Abc_LitNot(iLit)) >= 0 );
    // create inverter
    if ( fUseXor )
    {
        iObjNew = Cba_ObjAlloc( p, CBA_BOX_XOR, 2, 1 );
        Cba_ObjSetFinFon( p, iObjNew, 0, Vec_IntEntry(vLit2Fon, Abc_LitNot(iLit)) );
        Cba_ObjSetFinFon( p, iObjNew, 1, Cba_FonFromConst(1) );
    }
    else
    {
        iObjNew = Cba_ObjAlloc( p, CBA_BOX_INV, 1, 1 );
        Cba_ObjSetFinFon( p, iObjNew, 0, Vec_IntEntry(vLit2Fon, Abc_LitNot(iLit)) );
    }
    // save the result
    Vec_IntWriteEntry( vLit2Fon, iLit, Cba_ObjFon0(p, iObjNew) );
    return Cba_ObjFon0(p, iObjNew);
}